

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

_Bool art_node_iterator_lower_bound(art_node_t *node,art_iterator_t *iterator,art_key_chunk_t *key)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  size_t i;
  uint8_t *puVar5;
  ulong uVar6;
  long lVar7;
  art_inner_node_t *node_00;
  art_val_t *key1;
  
  do {
    if (((ulong)node & 1) != 0) {
      key1 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
      iVar4 = art_compare_keys((art_key_chunk_t *)key1,key);
      if (-1 < iVar4) {
        bVar1 = iterator->frame;
        iterator->frames[bVar1].node = node;
        iterator->frames[bVar1].index_in_node = '\0';
        *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(key1->key + 4);
        *(undefined4 *)iterator->key = *(undefined4 *)key1->key;
        iterator->value = key1;
        return true;
      }
      goto LAB_00110cb0;
    }
    bVar1 = iterator->depth;
    bVar2 = ((art_inner_node_t *)node)->prefix_size;
    iVar4 = memcmp(((art_inner_node_t *)node)->prefix,key + bVar1,(ulong)bVar2);
    if (iVar4 < 0) goto LAB_00110cb0;
    node_00 = (art_inner_node_t *)node;
    if (iVar4 != 0) break;
    if (3 < ((art_inner_node_t *)node)->typecode) goto LAB_00110cb0;
    bVar1 = (key + bVar1)[bVar2];
    uVar6 = (ulong)bVar1;
    switch(((art_inner_node_t *)node)->typecode) {
    case '\0':
      uVar6 = 0;
      while( true ) {
        if (((art_inner_node_t *)((long)node + 7))->typecode == uVar6) goto LAB_00110cb0;
        bVar2 = ((art_inner_node_t *)((long)node + 7))->prefix[uVar6 - 1];
        if (bVar1 <= bVar2) break;
        uVar6 = uVar6 + 1;
      }
      node_00 = *(art_inner_node_t **)((long)node + uVar6 * 8 + 0x10);
      goto LAB_00110c30;
    case '\x01':
      uVar6 = 0;
      while( true ) {
        if (((art_inner_node_t *)((long)node + 7))->typecode == uVar6) goto LAB_00110cb0;
        bVar2 = ((art_inner_node_t *)((long)node + 7))->prefix[uVar6 - 1];
        if (bVar1 <= bVar2) break;
        uVar6 = uVar6 + 1;
      }
      node_00 = *(art_inner_node_t **)((long)node + uVar6 * 8 + 0x18);
LAB_00110c30:
      lVar7 = (ulong)bVar2 * 0x100 + uVar6;
      break;
    case '\x02':
      lVar7 = uVar6 * 0x101;
      puVar5 = ((art_inner_node_t *)((long)node + 0xe))->prefix + uVar6;
      while( true ) {
        if (lVar7 == 0x10100) goto LAB_00110cb0;
        if ((ulong)*puVar5 != 0x30) break;
        lVar7 = lVar7 + 0x101;
        puVar5 = puVar5 + 1;
      }
      node_00 = *(art_inner_node_t **)((long)node + (ulong)*puVar5 * 8 + 0x110);
      break;
    case '\x03':
      for (; uVar6 != 0x100; uVar6 = uVar6 + 1) {
        node_00 = *(art_inner_node_t **)((long)node + uVar6 * 8 + 0x10);
        if (node_00 != (art_inner_node_t *)0x0) goto LAB_00110c11;
      }
      node_00 = (art_inner_node_t *)0x0;
      uVar6 = 0;
LAB_00110c11:
      lVar7 = uVar6 * 0x101;
    }
    if (node_00 == (art_inner_node_t *)0x0) {
LAB_00110cb0:
      _Var3 = art_iterator_up_and_move(iterator,true);
      return _Var3;
    }
    art_iterator_down(iterator,(art_inner_node_t *)node,(uint8_t)lVar7);
    node = (art_node_t *)node_00;
  } while (((uint)((ulong)lVar7 >> 8) & 0xff) <= (uint)bVar1);
  art_node_init_iterator((art_node_t *)node_00,iterator,true);
  return true;
}

Assistant:

static bool art_node_iterator_lower_bound(const art_node_t *node,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(node)) {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return the
            // next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first leaf.
            return art_node_init_iterator(node, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child =
            art_node_lower_bound(node, key_chunk);
        if (indexed_child.child == NULL) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, inner_node, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, inner_node, indexed_child.index);
        node = indexed_child.child;
    }
    art_leaf_t *leaf = CAST_LEAF(node);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, leaf);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the next
    // leaf.
    return art_iterator_up_and_move(iterator, true);
}